

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildInfo.cpp
# Opt level: O0

string * jbcoin::BuildInfo::getVersionString_abi_cxx11_(void)

{
  int iVar1;
  undefined1 local_9;
  
  if (getVersionString[abi:cxx11]()::value_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getVersionString[abi:cxx11]()::value_abi_cxx11_);
    if (iVar1 != 0) {
      getVersionString[abi:cxx11]()::$_0::operator()[abi_cxx11_
                (&getVersionString[abi:cxx11]()::value_abi_cxx11_,&local_9);
      __cxa_atexit(std::__cxx11::string::~string,&getVersionString[abi:cxx11]()::value_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&getVersionString[abi:cxx11]()::value_abi_cxx11_);
    }
  }
  return &getVersionString[abi:cxx11]()::value_abi_cxx11_;
}

Assistant:

std::string const&
getVersionString ()
{
    static std::string const value = [] {
        std::string const s = versionString;
        beast::SemanticVersion v;
        if (!v.parse (s) || v.print () != s)
            LogicError (s + ": Bad server version string");
        return s;
    }();
    return value;
}